

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcppLibrary.hpp
# Opt level: O0

void __thiscall
tcpp::Preprocessor::_processElseConditional(Preprocessor *this,TIfStackEntry *currStackEntry)

{
  byte local_39;
  TErrorInfo local_28;
  TIfStackEntry *local_18;
  TIfStackEntry *currStackEntry_local;
  Preprocessor *this_local;
  
  if ((currStackEntry->mHasElseBeenFound & 1U) == 0) {
    local_39 = 1;
    if ((currStackEntry->mHasIfBlockBeenEntered & 1U) == 0) {
      local_39 = currStackEntry->mShouldBeSkipped ^ 0xff;
    }
    currStackEntry->mShouldBeSkipped = (bool)(local_39 & 1);
    currStackEntry->mHasElseBeenFound = true;
  }
  else {
    local_28.mType = ANOTHER_ELSE_BLOCK_FOUND;
    local_18 = currStackEntry;
    currStackEntry_local = (TIfStackEntry *)this;
    local_28.mLine = Lexer::GetCurrLineIndex(this->mpLexer);
    Catch::clara::std::function<void_(const_tcpp::TErrorInfo_&)>::operator()
              ((function<void_(const_tcpp::TErrorInfo_&)> *)&this->mOnErrorCallback,&local_28);
  }
  return;
}

Assistant:

void Preprocessor::_processElseConditional(TIfStackEntry& currStackEntry) TCPP_NOEXCEPT
	{
		if (currStackEntry.mHasElseBeenFound)
		{
			mOnErrorCallback({ E_ERROR_TYPE::ANOTHER_ELSE_BLOCK_FOUND, mpLexer->GetCurrLineIndex() });
			return;
		}

		currStackEntry.mShouldBeSkipped  = 
			currStackEntry.mHasIfBlockBeenEntered || 
			!currStackEntry.mShouldBeSkipped;

		currStackEntry.mHasElseBeenFound = true;
	}